

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int GaussPlane_F32(float *src,int src_stride,float *dst,int dst_stride,int width,int height)

{
  void *__ptr;
  void *__s;
  float *dst_00;
  int in_ECX;
  float *in_RDX;
  int in_ESI;
  float *in_RDI;
  int in_R8D;
  int in_R9D;
  float *src4;
  float *src3;
  float *src2;
  float *src1;
  float *src0;
  float *row;
  uint8_t *rowbuf;
  uint8_t *rowbuf_mem;
  _func_void_float_ptr_float_ptr_int *GaussRow_F32;
  _func_void_float_ptr_float_ptr_float_ptr_float_ptr_float_ptr_float_ptr_int *GaussCol_F32;
  int y;
  int local_9c;
  int local_8c;
  float *local_80;
  float *local_78;
  float *local_70;
  float *local_68;
  float *local_60;
  int local_30;
  int local_2c;
  float *local_20;
  int local_14;
  float *local_10;
  int local_4;
  
  if ((((in_RDI == (float *)0x0) || (in_RDX == (float *)0x0)) || (in_R8D < 1)) || (in_R9D == 0)) {
    local_4 = -1;
  }
  else {
    local_2c = in_R9D;
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (in_R9D < 0) {
      local_2c = -in_R9D;
      local_10 = in_RDI + (local_2c + -1) * in_ESI;
      local_14 = -in_ESI;
    }
    __ptr = malloc((long)((in_R8D + 8) * 4 + 0x3f));
    __s = (void *)((long)__ptr + 0x3fU & 0xffffffffffffffc0);
    memset(__s,0,0x10);
    memset((void *)((long)__s + (long)((in_R8D + 4) * 4)),0,0x10);
    dst_00 = (float *)((long)__s + 0x10);
    local_60 = local_10;
    local_68 = local_10;
    local_70 = local_10;
    if (local_2c < 2) {
      local_8c = 0;
    }
    else {
      local_8c = local_14;
    }
    local_78 = local_10 + local_8c;
    if (local_2c < 3) {
      local_9c = 0;
    }
    else {
      local_9c = local_14;
    }
    local_80 = local_78 + local_9c;
    local_20 = in_RDX;
    for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
      GaussCol_F32_C(local_60,local_68,local_70,local_78,local_80,dst_00,in_R8D);
      *(float *)((long)__s + 0xc) = *dst_00;
      *(float *)((long)__s + 8) = *dst_00;
      dst_00[in_R8D] = dst_00[in_R8D + -1];
      dst_00[in_R8D + 1] = dst_00[in_R8D + -1];
      GaussRow_F32_C((float *)((long)__s + 8),local_20,in_R8D);
      local_60 = local_68;
      local_68 = local_70;
      local_70 = local_78;
      local_78 = local_80;
      if (local_30 + 2 < local_2c + -1) {
        local_80 = local_80 + local_14;
      }
      local_20 = local_20 + in_ECX;
    }
    free(__ptr);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int GaussPlane_F32(const float* src,
                   int src_stride,
                   float* dst,
                   int dst_stride,
                   int width,
                   int height) {
  int y;
  void (*GaussCol_F32)(const float* src0, const float* src1, const float* src2,
                       const float* src3, const float* src4, float* dst,
                       int width) = GaussCol_F32_C;
  void (*GaussRow_F32)(const float* src, float* dst, int width) =
      GaussRow_F32_C;
  if (!src || !dst || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src = src + (height - 1) * src_stride;
    src_stride = -src_stride;
  }

#if defined(HAS_GAUSSCOL_F32_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    GaussCol_F32 = GaussCol_F32_NEON;
  }
#endif
#if defined(HAS_GAUSSROW_F32_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    GaussRow_F32 = GaussRow_F32_NEON;
  }
#endif
  {
    // 2 pixels on each side, but aligned out to 16 bytes.
    align_buffer_64(rowbuf, (4 + width + 4) * 4);
    memset(rowbuf, 0, 16);
    memset(rowbuf + (4 + width) * 4, 0, 16);
    float* row = (float*)(rowbuf + 16);
    const float* src0 = src;
    const float* src1 = src;
    const float* src2 = src;
    const float* src3 = src2 + ((height > 1) ? src_stride : 0);
    const float* src4 = src3 + ((height > 2) ? src_stride : 0);

    for (y = 0; y < height; ++y) {
      GaussCol_F32(src0, src1, src2, src3, src4, row, width);

      // Extrude edge by 2 floats
      row[-2] = row[-1] = row[0];
      row[width + 1] = row[width] = row[width - 1];

      GaussRow_F32(row - 2, dst, width);

      src0 = src1;
      src1 = src2;
      src2 = src3;
      src3 = src4;
      if ((y + 2) < (height - 1)) {
        src4 += src_stride;
      }
      dst += dst_stride;
    }
    free_aligned_buffer_64(rowbuf);
  }
  return 0;
}